

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<unsigned_long>,unsigned_long,duckdb::BitXorOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  ulong *puVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  UnifiedVectorFormat idata;
  long *local_68;
  long local_60;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if (*input == (Vector)0x0) {
    lVar3 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      lVar2 = *(long *)(input + 0x28);
      uVar9 = 0;
      uVar5 = 0;
      do {
        if (lVar2 == 0) {
          uVar6 = uVar5 + 0x40;
          if (count <= uVar5 + 0x40) {
            uVar6 = count;
          }
LAB_004ac803:
          uVar11 = uVar5;
          if (uVar5 < uVar6) {
            bVar4 = *state;
            uVar10 = *(ulong *)(state + 8);
            do {
              uVar11 = *(ulong *)(lVar3 + uVar5 * 8);
              if ((bVar4 & 1) == 0) {
                *state = '\x01';
                bVar4 = 1;
              }
              else {
                uVar11 = uVar10 ^ uVar11;
              }
              uVar5 = uVar5 + 1;
              uVar10 = uVar11;
            } while (uVar6 != uVar5);
            *(ulong *)(state + 8) = uVar11;
            uVar11 = uVar6;
          }
        }
        else {
          uVar10 = *(ulong *)(lVar2 + uVar9 * 8);
          uVar6 = uVar5 + 0x40;
          if (count <= uVar5 + 0x40) {
            uVar6 = count;
          }
          if (uVar10 == 0xffffffffffffffff) goto LAB_004ac803;
          uVar11 = uVar6;
          if ((uVar10 != 0) && (uVar11 = uVar5, uVar5 < uVar6)) {
            uVar12 = 0;
            do {
              if ((uVar10 >> (uVar12 & 0x3f) & 1) != 0) {
                uVar11 = *(ulong *)(lVar3 + uVar5 * 8 + uVar12 * 8);
                if (*state == '\0') {
                  *(ulong *)(state + 8) = uVar11;
                  *state = '\x01';
                }
                else {
                  *(ulong *)(state + 8) = *(ulong *)(state + 8) ^ uVar11;
                }
              }
              uVar12 = uVar12 + 1;
              uVar11 = uVar6;
            } while (uVar6 - uVar5 != uVar12);
          }
        }
        uVar9 = uVar9 + 1;
        uVar5 = uVar11;
      } while (uVar9 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if (((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) &&
       (count != 0)) {
      puVar1 = *(ulong **)(input + 0x20);
      bVar4 = *state;
      do {
        uVar5 = *puVar1;
        if ((bVar4 & 1) == 0) {
          *state = '\x01';
          bVar4 = 1;
        }
        else {
          uVar5 = uVar5 ^ *(ulong *)(state + 8);
        }
        *(ulong *)(state + 8) = uVar5;
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_58 == 0) {
      if (count != 0) {
        lVar3 = *local_68;
        bVar4 = *state;
        iVar7 = 0;
        uVar5 = *(ulong *)(state + 8);
        do {
          iVar8 = iVar7;
          if (lVar3 != 0) {
            iVar8 = (idx_t)*(uint *)(lVar3 + iVar7 * 4);
          }
          uVar9 = *(ulong *)(local_60 + iVar8 * 8);
          if ((bVar4 & 1) == 0) {
            *state = '\x01';
            bVar4 = 1;
          }
          else {
            uVar9 = uVar5 ^ uVar9;
          }
          iVar7 = iVar7 + 1;
          uVar5 = uVar9;
        } while (count != iVar7);
        *(ulong *)(state + 8) = uVar9;
      }
    }
    else if (count != 0) {
      lVar3 = *local_68;
      iVar7 = 0;
      do {
        iVar8 = iVar7;
        if (lVar3 != 0) {
          iVar8 = (idx_t)*(uint *)(lVar3 + iVar7 * 4);
        }
        if ((*(ulong *)(local_58 + (iVar8 >> 6) * 8) >> (iVar8 & 0x3f) & 1) != 0) {
          uVar5 = *(ulong *)(local_60 + iVar8 * 8);
          if (*state == '\0') {
            *(ulong *)(state + 8) = uVar5;
            *state = '\x01';
          }
          else {
            *(ulong *)(state + 8) = *(ulong *)(state + 8) ^ uVar5;
          }
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}